

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::SwiftCompilerShellCommand::start
          (SwiftCompilerShellCommand *this,BuildSystem *system,TaskInterface ti)

{
  StringRef taskData;
  StringRef name;
  TaskInterface ti_local;
  string local_58 [32];
  BuildKey getVersionKey;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  llbuild::buildsystem::ExternalCommand::start(&this->super_ExternalCommand,system,ti);
  taskData.Data = (this->executable)._M_dataplus._M_p;
  taskData.Length = (this->executable)._M_string_length;
  name.Length = 0x11;
  name.Data = "swift-get-version";
  llbuild::buildsystem::BuildKey::makeCustomTask(&getVersionKey,name,taskData);
  std::__cxx11::string::string(local_58,(string *)&getVersionKey);
  llbuild::core::TaskInterface::request(&ti_local,(KeyType *)local_58,0xfffffffffffffeff);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual void start(BuildSystem& system, TaskInterface ti) override {
    ExternalCommand::start(system, ti);
    
    // The Swift compiler version is also an input.
    //
    // FIXME: We need to fix the input ID situation, this is not extensible. We
    // either have to build a registration of the custom tasks so they can divy
    // up the input ID namespace, or we should just use the keys. Probably move
    // to just using the keys, unless there is a place where that is really not
    // cheap.
    auto getVersionKey = BuildKey::makeCustomTask(
        "swift-get-version", executable);
    ti.request(getVersionKey.toData(), core::BuildEngine::kMaximumInputID - 1);
  }